

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  bool bVar1;
  int osErrorNumber;
  void *pvVar2;
  LowLevelAsyncIoProvider *fd;
  OwnFd *pOVar3;
  AsyncCapabilityStream *pAVar4;
  bool local_219;
  DebugExpression<const_char_(&)[4]> DStack_218;
  bool _kj_shouldLog_1;
  undefined1 local_210 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition_1;
  DebugExpression<const_char_(&)[4]> DStack_1e0;
  bool _kj_shouldLog;
  undefined1 local_1d8 [8];
  DebugComparison<const_char_(&)[4],_kj::String_&> _kjCondition;
  SourceLocation local_1a8;
  undefined1 local_190 [8];
  String result2;
  SourceLocation local_170;
  undefined1 local_158 [8];
  String result;
  undefined1 local_118 [16];
  Promise<unsigned_long> local_108;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:616:11),_unsigned_long>
  promise2;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receivedStream;
  undefined1 local_d0 [16];
  Type local_c0;
  Promise<unsigned_long> local_b8;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:605:11),_unsigned_long>
  promise;
  Own<kj::AsyncIoStream,_std::nullptr_t> clientStream;
  char receiveBuffer2 [4];
  char receiveBuffer1 [4];
  CapabilityPipe pipe2;
  OwnFd sokcetServer;
  OwnFd socketClient;
  Fault f;
  anon_class_8_1_ec5d61a2 local_58;
  SyscallResult local_4c;
  int iStack_48;
  SyscallResult _kjSyscallResult;
  int socketFds [2];
  AsyncIoContext io;
  TestCase581 *this_local;
  
  setupAsyncIo();
  _iStack_48 = 0;
  local_58.socketFds = (int (*) [2])&iStack_48;
  local_4c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase581::run()::__0>
                       (&local_58,false);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4c);
  if (pvVar2 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_4c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&sokcetServer,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x24d,osErrorNumber,"socketpair(AF_UNIX, SOCK_STREAM, 0, socketFds)","");
    kj::_::Debug::Fault::fatal((Fault *)&sokcetServer);
  }
  OwnFd::OwnFd((OwnFd *)((long)&pipe2.ends[1].ptr + 4),iStack_48);
  OwnFd::OwnFd((OwnFd *)&pipe2.ends[1].ptr,_kjSyscallResult.errorNumber);
  newCapabilityPipe();
  fd = Own<kj::LowLevelAsyncIoProvider,_std::nullptr_t>::operator->
                 ((Own<kj::LowLevelAsyncIoProvider,_std::nullptr_t> *)socketFds);
  pOVar3 = mv<kj::OwnFd>((OwnFd *)((long)&pipe2.ends[1].ptr + 4));
  LowLevelAsyncIoProvider::wrapSocketFd
            ((LowLevelAsyncIoProvider *)&promise,(OwnFd *)fd,(uint)pOVar3);
  pAVar4 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)receiveBuffer2);
  pOVar3 = mv<kj::OwnFd>((OwnFd *)&pipe2.ends[1].ptr);
  OwnFd::operator_cast_to_int(pOVar3);
  AsyncCapabilityStream::sendFd((AsyncCapabilityStream *)local_d0,(int)pAVar4);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase581::run()::__1>
            ((Promise<void> *)(local_d0 + 8),(Type *)local_d0);
  Promise<void>::then<kj::(anonymous_namespace)::TestCase581::run()::__2>
            ((Promise<void> *)&local_c0,(Type *)(local_d0 + 8));
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase581::run()::__3>
            (&local_b8,&local_c0);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&local_c0);
  Promise<void>::~Promise((Promise<void> *)(local_d0 + 8));
  Promise<void>::~Promise((Promise<void> *)local_d0);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&promise2);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&pipe2.ends[0].ptr);
  AsyncCapabilityStream::receiveFd((AsyncCapabilityStream *)local_118);
  Promise<kj::OwnFd>::then<kj::(anonymous_namespace)::TestCase581::run()::__4>
            ((Promise<kj::OwnFd> *)(local_118 + 8),(Type *)local_118);
  result.content.disposer = (ArrayDisposer *)&promise2;
  Promise<unsigned_long>::then<kj::(anonymous_namespace)::TestCase581::run()::__5>
            (&local_108,(Type *)(local_118 + 8));
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)(local_118 + 8));
  Promise<kj::OwnFd>::~Promise((Promise<kj::OwnFd> *)local_118);
  SourceLocation::SourceLocation
            (&local_170,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x26f,0x17);
  Promise<kj::String>::wait((Promise<kj::String> *)local_158,&local_b8);
  SourceLocation::SourceLocation
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x270,0x18);
  Promise<kj::String>::wait((Promise<kj::String> *)local_190,&local_108);
  DStack_1e0 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x91cc8d);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1d8,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffe20,(String *)local_158);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d8);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[37],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x272,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (result)\", _kjCondition, \"bar\", result"
                 ,(char (*) [37])"failed: expected (\"bar\") == (result)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_1d8,
                 (char (*) [4])0x91cc8d,(String *)local_158);
      _kjCondition_1._39_1_ = 0;
    }
  }
  DStack_218 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])0x9422c6);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_kj::String_&> *)local_210,
             (DebugExpression<char_const(&)[4]> *)&stack0xfffffffffffffde8,(String *)local_190);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
  if (!bVar1) {
    local_219 = kj::_::Debug::shouldLog(ERROR);
    while (local_219 != false) {
      kj::_::Debug::
      log<char_const(&)[38],kj::_::DebugComparison<char_const(&)[4],kj::String&>&,char_const(&)[4],kj::String&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x273,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (result2)\", _kjCondition, \"foo\", result2"
                 ,(char (*) [38])"failed: expected (\"foo\") == (result2)",
                 (DebugComparison<const_char_(&)[4],_kj::String_&> *)local_210,
                 (char (*) [4])0x9422c6,(String *)local_190);
      local_219 = false;
    }
  }
  String::~String((String *)local_190);
  String::~String((String *)local_158);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_108);
  Own<kj::AsyncCapabilityStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&promise2);
  Promise<kj::String>::~Promise((Promise<kj::String> *)&local_b8);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)&promise);
  CapabilityPipe::~CapabilityPipe((CapabilityPipe *)receiveBuffer2);
  OwnFd::~OwnFd((OwnFd *)&pipe2.ends[1].ptr);
  OwnFd::~OwnFd((OwnFd *)((long)&pipe2.ends[1].ptr + 4));
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)socketFds);
  return;
}

Assistant:

TEST(AsyncIo, InMemoryCapabilityPipeFdsReverse) {
  // Same as above, except we do sendFd() first, then receiveFd(). This hits `BlockedWrite` instead
  // of `BlockedRead`. At one time there was a bug in that code that mishandled the file
  // descriptors.

  auto io = setupAsyncIo();

  int socketFds[2]{};
  KJ_SYSCALL(socketpair(AF_UNIX, SOCK_STREAM, 0, socketFds));
  kj::OwnFd socketClient(socketFds[0]);
  kj::OwnFd sokcetServer(socketFds[1]);

  auto pipe2 = newCapabilityPipe();
  char receiveBuffer1[4]{};
  char receiveBuffer2[4]{};

  // Send an FD, then write "foo" to the other end of the sent stream, then receive "bar"
  // from it.
  auto clientStream = io.lowLevelProvider->wrapSocketFd(kj::mv(socketClient));
  auto promise = pipe2.ends[0]->sendFd(kj::mv(sokcetServer))
      .then([&]() {
    return clientStream->write("foo"_kjb);
  }).then([&]() {
    return clientStream->tryRead(receiveBuffer1, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return heapString(receiveBuffer1, n);
  });

  // Expect to receive an FD, then read "foo" from it, then write "bar" to it.
  Own<AsyncCapabilityStream> receivedStream;
  auto promise2 = pipe2.ends[1]->receiveFd()
      .then([&](OwnFd fd) {
    receivedStream = io.lowLevelProvider->wrapUnixSocketFd(kj::mv(fd));
    return receivedStream->tryRead(receiveBuffer2, 3, 4);
  }).then([&](size_t n) {
    EXPECT_EQ(3u, n);
    return receivedStream->write("bar"_kjb).then([&receiveBuffer2,n]() {
      return heapString(receiveBuffer2, n);
    });
  });

  kj::String result = promise.wait(io.waitScope);
  kj::String result2 = promise2.wait(io.waitScope);

  EXPECT_EQ("bar", result);
  EXPECT_EQ("foo", result2);
}